

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O2

Duration * google::protobuf::operator*=(Duration *d,double r)

{
  long seconds;
  double dVar1;
  Duration local_38;
  
  dVar1 = ((double)d->nanos_ / 1000000000.0 + (double)d->seconds_) * r;
  seconds = (long)dVar1;
  util::anon_unknown_1::CreateNormalized<google::protobuf::Duration>
            (&local_38,seconds,(long)(int)((dVar1 - (double)seconds) * 1000000000.0));
  Duration::operator=(d,&local_38);
  Duration::~Duration(&local_38);
  return d;
}

Assistant:

Duration& operator*=(Duration& d, double r) {  // NOLINT
  double result = (d.seconds() * 1.0 + 1.0 * d.nanos() / kNanosPerSecond) * r;
  int64 seconds = static_cast<int64>(result);
  int32 nanos = static_cast<int32>((result - seconds) * kNanosPerSecond);
  // Note that we normalize here not just because nanos can have a different
  // sign from seconds but also that nanos can be any arbitrary value when
  // overflow happens (i.e., the result is a much larger value than what
  // int64 can represent).
  d = CreateNormalized<Duration>(seconds, nanos);
  return d;
}